

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O2

void __thiscall
ymfm::fm_operator<ymfm::opn_registers_base<false>_>::start_release
          (fm_operator<ymfm::opn_registers_base<false>_> *this)

{
  if ((this->m_env_state < EG_RELEASE) &&
     (this->m_env_state = EG_RELEASE, this->m_ssg_inverted != '\0')) {
    this->m_env_attenuation = 0x200 - this->m_env_attenuation & 0x3ff;
    this->m_ssg_inverted = '\0';
  }
  return;
}

Assistant:

void fm_operator<RegisterType>::start_release()
{
	// don't change anything if already in release state
	if (m_env_state >= EG_RELEASE)
		return;
	m_env_state = EG_RELEASE;

	// if attenuation if inverted due to SSG-EG, snap the inverted attenuation
	// as the starting point
	if (RegisterType::EG_HAS_SSG && m_ssg_inverted)
	{
		m_env_attenuation = (0x200 - m_env_attenuation) & 0x3ff;
		m_ssg_inverted = false;
	}
}